

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psa_crypto_slot_management.c
# Opt level: O1

psa_status_t psa_get_empty_key_slot(psa_key_handle_t *handle,psa_key_slot_t **p_slot)

{
  psa_status_t pVar1;
  psa_key_slot_t *ppVar2;
  ushort uVar3;
  
  pVar1 = -0x89;
  if ((global_data._1536_1_ & 1) != 0) {
    *handle = 0x20;
    uVar3 = 0x20;
    pVar1 = 0;
    do {
      if (global_data.key_slots[uVar3 - 1].attr.type == 0) {
        ppVar2 = global_data.key_slots + (uVar3 - 1);
        goto LAB_00113483;
      }
      uVar3 = uVar3 - 1;
      *handle = uVar3;
    } while (uVar3 != 0);
    pVar1 = -0x8d;
    ppVar2 = (psa_key_slot_t *)0x0;
LAB_00113483:
    *p_slot = ppVar2;
  }
  return pVar1;
}

Assistant:

psa_status_t psa_get_empty_key_slot( psa_key_handle_t *handle,
                                             psa_key_slot_t **p_slot )
{
    if( ! global_data.key_slots_initialized )
        return( PSA_ERROR_BAD_STATE );

    for( *handle = PSA_KEY_SLOT_COUNT; *handle != 0; --( *handle ) )
    {
        *p_slot = &global_data.key_slots[*handle - 1];
        if( ! psa_is_key_slot_occupied( *p_slot ) )
            return( PSA_SUCCESS );
    }
    *p_slot = NULL;
    return( PSA_ERROR_INSUFFICIENT_MEMORY );
}